

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128LowerSqrt(LowererMD *this,Instr *instr)

{
  Opnd *this_00;
  Opnd *this_01;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  
  this_00 = instr->m_dst;
  this_01 = instr->m_src1;
  if (this_00 == (Opnd *)0x0) {
LAB_005eb1a1:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x390,"(dst && dst->IsRegOpnd())","dst && dst->IsRegOpnd()");
    if (!bVar2) goto LAB_005eb2ec;
    *puVar3 = 0;
  }
  else {
    bVar2 = IR::Opnd::IsRegOpnd(this_00);
    if (!bVar2) goto LAB_005eb1a1;
  }
  if (this_01 == (Opnd *)0x0) {
LAB_005eb205:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x391,"(src1 && src1->IsRegOpnd())","src1 && src1->IsRegOpnd()");
    if (!bVar2) goto LAB_005eb2ec;
    *puVar3 = 0;
  }
  else {
    bVar2 = IR::Opnd::IsRegOpnd(this_01);
    if (!bVar2) goto LAB_005eb205;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x392,"(instr->GetSrc2() == nullptr)","instr->GetSrc2() == nullptr");
    if (!bVar2) {
LAB_005eb2ec:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pIVar4 = IR::Instr::New(SQRTPS,this_00,this_01,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  pIVar4 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar4;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerSqrt(IR::Instr *instr)
{
    Js::OpCode opcode = Js::OpCode::SQRTPS;

    IR::Opnd *dst, *src1;
    dst = instr->GetDst();
    src1 = instr->GetSrc1();

    Assert(dst && dst->IsRegOpnd());
    Assert(src1 && src1->IsRegOpnd());
    Assert(instr->GetSrc2() == nullptr);
    opcode = Js::OpCode::SQRTPS;
#if 0
    {
        Assert(instr->m_opcode == Js::OpCode::Simd128_Sqrt_D2);
        opcode = Js::OpCode::SQRTPD;
    }
#endif // 0

    instr->InsertBefore(IR::Instr::New(opcode, dst, src1, m_func));
    IR::Instr* prevInstr = instr->m_prev;
    instr->Remove();
    return prevInstr;
}